

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

bool __thiscall duckdb_re2::DFA::InlinedSearchLoop<true,true,false>(DFA *this,SearchParams *params)

{
  bool bVar1;
  const_pointer pcVar2;
  size_type sVar3;
  void *v;
  ulong uVar4;
  size_type sVar5;
  RWLocker *cache_lock;
  RWLocker *pRVar6;
  ostream *poVar7;
  StringPiece *in_RSI;
  undefined8 *in_RDI;
  int id_2;
  int i_2;
  StateSaver save_s_1;
  State *ns;
  int lastbyte;
  int id_1;
  int i_1;
  StateSaver save_s;
  StateSaver save_start;
  State *ns_1;
  int c;
  int id;
  int i;
  State *s;
  bool matched;
  uint8_t *lastmatch;
  uint8_t *bytemap;
  uint8_t *resetp;
  uint8_t *ep;
  uint8_t *p;
  uint8_t *bp;
  State *start;
  undefined4 in_stack_fffffffffffffb88;
  int in_stack_fffffffffffffb8c;
  LogMessage *in_stack_fffffffffffffb90;
  Prog *in_stack_fffffffffffffb98;
  LogMessage *in_stack_fffffffffffffba0;
  LogMessage *this_00;
  RWLocker *in_stack_fffffffffffffba8;
  DFA *in_stack_fffffffffffffbb0;
  int c_00;
  DFA *in_stack_fffffffffffffbb8;
  DFA *in_stack_fffffffffffffbc0;
  int local_41c;
  StateSaver *in_stack_fffffffffffffd38;
  LogMessage *local_270;
  MatchKind local_25c;
  LogMessage local_258;
  int local_d8;
  DFA *local_78;
  uint local_6c;
  int local_68;
  MatchKind local_64;
  LogMessage *local_60;
  byte local_51;
  uint8_t *local_50;
  uint8_t *local_48;
  uint8_t *local_40;
  uint8_t *local_38;
  uint8_t *local_30;
  uint8_t *local_28;
  DFA *local_20;
  StringPiece *local_18;
  byte local_1;
  
  local_20 = (DFA *)in_RSI[2].size_;
  local_18 = in_RSI;
  pcVar2 = StringPiece::data(in_RSI);
  local_30 = BytePtr(pcVar2);
  local_28 = local_30;
  pcVar2 = StringPiece::data(local_18);
  sVar3 = StringPiece::size(local_18);
  local_38 = BytePtr(pcVar2 + sVar3);
  local_40 = (uint8_t *)0x0;
  std::swap<unsigned_char_const*>(&local_30,&local_38);
  local_48 = Prog::bytemap((Prog *)*in_RDI);
  local_50 = (uint8_t *)0x0;
  local_51 = 0;
  local_60 = (LogMessage *)local_20;
  bVar1 = State::IsMatch((State *)local_20);
  if (bVar1) {
    local_51 = 1;
    local_50 = local_30;
    if ((local_18[4].size_ != 0) && (*(int *)(in_RDI + 1) == 3)) {
      local_64 = *(MatchKind *)&local_60->str_;
      while ((local_64 = local_64 - kLongestMatch, -1 < (int)local_64 &&
             (local_68 = (*(Prog **)&local_60->flushed_)->inst_count_[(long)(int)local_64 + -0xd],
             local_68 != -2))) {
        SparseSetT<void>::insert
                  ((SparseSetT<void> *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c);
      }
    }
    local_18[4].data_ = (const_pointer)local_50;
    local_1 = 1;
  }
  else {
    do {
      if (local_30 == local_38) {
LAB_0082a22a:
        cache_lock = (RWLocker *)BeginPtr((StringPiece *)0x82a237);
        pRVar6 = (RWLocker *)BeginPtr((StringPiece *)0x82a24d);
        if (cache_lock != pRVar6) {
          BeginPtr((StringPiece *)0x82a274);
        }
        this_00 = (LogMessage *)(((Mutex *)&local_60->field_0x10)->mutex_).__align;
        ByteMap((DFA *)in_stack_fffffffffffffb98,(int)((ulong)in_stack_fffffffffffffb90 >> 0x20));
        local_270 = (LogMessage *)
                    std::atomic<duckdb_re2::DFA::State_*>::load
                              ((atomic<duckdb_re2::DFA::State_*> *)in_stack_fffffffffffffb98,
                               (memory_order)((ulong)in_stack_fffffffffffffb90 >> 0x20));
        if ((local_270 == (LogMessage *)0x0) &&
           (local_270 = (LogMessage *)
                        RunStateOnByteUnlocked
                                  (in_stack_fffffffffffffbc0,(State *)in_stack_fffffffffffffbb8,
                                   (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20)),
           local_270 == (LogMessage *)0x0)) {
          StateSaver::StateSaver
                    ((StateSaver *)this_00,(DFA *)in_stack_fffffffffffffb98,
                     (State *)in_stack_fffffffffffffb90);
          ResetCache(in_stack_fffffffffffffbb0,cache_lock);
          c_00 = (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20);
          local_60 = (LogMessage *)StateSaver::Restore(in_stack_fffffffffffffd38);
          if (local_60 == (LogMessage *)0x0) {
            *(undefined1 *)&local_18[3].size_ = 1;
            local_1 = 0;
            local_d8 = 1;
          }
          else {
            local_270 = (LogMessage *)
                        RunStateOnByteUnlocked
                                  (in_stack_fffffffffffffbc0,(State *)in_stack_fffffffffffffbb8,c_00
                                  );
            in_stack_fffffffffffffb90 = local_270;
            if (local_270 == (LogMessage *)0x0) {
              LogMessage::LogMessage
                        ((LogMessage *)0x0,
                         (char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),0);
              poVar7 = LogMessage::stream((LogMessage *)&stack0xfffffffffffffbe8);
              std::operator<<(poVar7,"RunStateOnByteUnlocked failed after Reset");
              LogMessage::~LogMessage(this_00);
              *(undefined1 *)&local_18[3].size_ = 1;
              local_1 = 0;
              local_d8 = 1;
            }
            else {
              local_d8 = 0;
            }
          }
          StateSaver::~StateSaver((StateSaver *)in_stack_fffffffffffffb90);
          if (local_d8 != 0) goto LAB_0082a5d4;
        }
        if (local_270 < (LogMessage *)0x3) {
          if (local_270 == (LogMessage *)0x1) {
            local_18[4].data_ = (const_pointer)local_50;
            local_1 = local_51 & 1;
          }
          else {
            local_18[4].data_ = (const_pointer)local_38;
            local_1 = 1;
          }
        }
        else {
          local_60 = local_270;
          bVar1 = State::IsMatch((State *)local_270);
          if (bVar1) {
            local_51 = 1;
            local_50 = local_30;
            if ((local_18[4].size_ != 0) && (*(int *)(in_RDI + 1) == 3)) {
              local_41c = *(int *)&local_60->str_;
              while ((local_41c = local_41c + -1, -1 < local_41c &&
                     (*(int *)(*(long *)local_60 + (long)local_41c * 4) != -2))) {
                SparseSetT<void>::insert
                          ((SparseSetT<void> *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c);
              }
            }
          }
          local_18[4].data_ = (const_pointer)local_50;
          local_1 = local_51 & 1;
        }
        goto LAB_0082a5d4;
      }
      if (local_60 == (LogMessage *)local_20) {
        v = Prog::PrefixAccel(in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
                              CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
        local_30 = BytePtr(v);
        if (local_30 == (uint8_t *)0x0) {
          local_30 = local_38;
          goto LAB_0082a22a;
        }
      }
      local_6c = (uint)local_30[-1];
      local_30 = local_30 + -1;
      local_78 = (DFA *)std::atomic<duckdb_re2::DFA::State_*>::load
                                  ((atomic<duckdb_re2::DFA::State_*> *)in_stack_fffffffffffffb98,
                                   (memory_order)((ulong)in_stack_fffffffffffffb90 >> 0x20));
      if ((local_78 == (DFA *)0x0) &&
         (local_78 = (DFA *)RunStateOnByteUnlocked
                                      (in_stack_fffffffffffffbc0,(State *)in_stack_fffffffffffffbb8,
                                       (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20)),
         local_78 == (DFA *)0x0)) {
        if (((dfa_should_bail_when_slow & 1) != 0) &&
           (((local_40 != (uint8_t *)0x0 &&
             (uVar4 = (long)local_30 - (long)local_40,
             sVar5 = std::
                     unordered_set<duckdb_re2::DFA::State_*,_duckdb_re2::DFA::StateHash,_duckdb_re2::DFA::StateEqual,_std::allocator<duckdb_re2::DFA::State_*>_>
                     ::size((unordered_set<duckdb_re2::DFA::State_*,_duckdb_re2::DFA::StateHash,_duckdb_re2::DFA::StateEqual,_std::allocator<duckdb_re2::DFA::State_*>_>
                             *)0x829e70), uVar4 < sVar5 * 10)) && (*(int *)(in_RDI + 1) != 3)))) {
          *(undefined1 *)&local_18[3].size_ = 1;
          local_1 = 0;
          goto LAB_0082a5d4;
        }
        local_40 = local_30;
        StateSaver::StateSaver
                  ((StateSaver *)in_stack_fffffffffffffba0,(DFA *)in_stack_fffffffffffffb98,
                   (State *)in_stack_fffffffffffffb90);
        StateSaver::StateSaver
                  ((StateSaver *)in_stack_fffffffffffffba0,(DFA *)in_stack_fffffffffffffb98,
                   (State *)in_stack_fffffffffffffb90);
        ResetCache(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
        in_stack_fffffffffffffbc0 = (DFA *)StateSaver::Restore(in_stack_fffffffffffffd38);
        local_20 = in_stack_fffffffffffffbc0;
        if ((in_stack_fffffffffffffbc0 == (DFA *)0x0) ||
           (in_stack_fffffffffffffbb8 = (DFA *)StateSaver::Restore(in_stack_fffffffffffffd38),
           local_60 = (LogMessage *)in_stack_fffffffffffffbb8,
           in_stack_fffffffffffffbb8 == (DFA *)0x0)) {
          *(undefined1 *)&local_18[3].size_ = 1;
          local_1 = 0;
          local_d8 = 1;
        }
        else {
          in_stack_fffffffffffffbb0 =
               (DFA *)RunStateOnByteUnlocked
                                (in_stack_fffffffffffffbc0,(State *)in_stack_fffffffffffffbb8,
                                 (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20));
          local_78 = in_stack_fffffffffffffbb0;
          if (in_stack_fffffffffffffbb0 == (DFA *)0x0) {
            LogMessage::LogMessage
                      (in_stack_fffffffffffffb90,
                       (char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),0);
            poVar7 = LogMessage::stream(&local_258);
            std::operator<<(poVar7,"RunStateOnByteUnlocked failed after ResetCache");
            LogMessage::~LogMessage(in_stack_fffffffffffffba0);
            *(undefined1 *)&local_18[3].size_ = 1;
            local_1 = 0;
            local_d8 = 1;
          }
          else {
            local_d8 = 0;
          }
        }
        StateSaver::~StateSaver((StateSaver *)in_stack_fffffffffffffb90);
        StateSaver::~StateSaver((StateSaver *)in_stack_fffffffffffffb90);
        if (local_d8 != 0) goto LAB_0082a5d4;
      }
      if (local_78 < (DFA *)0x3) {
        if (local_78 == (DFA *)0x1) {
          local_18[4].data_ = (const_pointer)local_50;
          local_1 = local_51 & 1;
        }
        else {
          local_18[4].data_ = (const_pointer)local_38;
          local_1 = 1;
        }
        goto LAB_0082a5d4;
      }
      local_60 = (LogMessage *)local_78;
      bVar1 = State::IsMatch((State *)local_78);
    } while (!bVar1);
    local_51 = 1;
    local_50 = local_30 + 1;
    if ((local_18[4].size_ != 0) && (*(int *)(in_RDI + 1) == 3)) {
      local_25c = *(MatchKind *)&local_60->str_;
      while ((local_25c = local_25c - kLongestMatch, -1 < (int)local_25c &&
             ((*(Prog **)&local_60->flushed_)->inst_count_[(long)(int)local_25c + -0xd] != -2))) {
        SparseSetT<void>::insert
                  ((SparseSetT<void> *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c);
      }
    }
    local_18[4].data_ = (const_pointer)local_50;
    local_1 = 1;
  }
LAB_0082a5d4:
  return (bool)(local_1 & 1);
}

Assistant:

inline bool DFA::InlinedSearchLoop(SearchParams* params) {
  State* start = params->start;
  const uint8_t* bp = BytePtr(params->text.data());  // start of text
  const uint8_t* p = bp;                             // text scanning point
  const uint8_t* ep = BytePtr(params->text.data() +
                              params->text.size());  // end of text
  const uint8_t* resetp = NULL;                      // p at last cache reset
  if (!run_forward) {
    using std::swap;
    swap(p, ep);
  }

  const uint8_t* bytemap = prog_->bytemap();
  const uint8_t* lastmatch = NULL;   // most recent matching position in text
  bool matched = false;

  State* s = start;

  if (s->IsMatch()) {
    matched = true;
    lastmatch = p;
    if (params->matches != NULL && kind_ == Prog::kManyMatch) {
      for (int i = s->ninst_ - 1; i >= 0; i--) {
        int id = s->inst_[i];
        if (id == MatchSep)
          break;
        params->matches->insert(id);
      }
    }
    if (want_earliest_match) {
      params->ep = reinterpret_cast<const char*>(lastmatch);
      return true;
    }
  }

  while (p != ep) {

    if (can_prefix_accel && s == start) {
      // In start state, only way out is to find the prefix,
      // so we use prefix accel (e.g. memchr) to skip ahead.
      // If not found, we can skip to the end of the string.
      p = BytePtr(prog_->PrefixAccel(p, ep - p));
      if (p == NULL) {
        p = ep;
        break;
      }
    }

    int c;
    if (run_forward)
      c = *p++;
    else
      c = *--p;

    // Note that multiple threads might be consulting
    // s->next_[bytemap[c]] simultaneously.
    // RunStateOnByte takes care of the appropriate locking,
    // including a memory barrier so that the unlocked access
    // (sometimes known as "double-checked locking") is safe.
    // The alternative would be either one DFA per thread
    // or one mutex operation per input byte.
    //
    // ns == DeadState means the state is known to be dead
    // (no more matches are possible).
    // ns == NULL means the state has not yet been computed
    // (need to call RunStateOnByteUnlocked).
    // RunStateOnByte returns ns == NULL if it is out of memory.
    // ns == FullMatchState means the rest of the string matches.
    //
    // Okay to use bytemap[] not ByteMap() here, because
    // c is known to be an actual byte and not kByteEndText.

    State* ns = s->next_[bytemap[c]].load(std::memory_order_acquire);
    if (ns == NULL) {
      ns = RunStateOnByteUnlocked(s, c);
      if (ns == NULL) {
        // After we reset the cache, we hold cache_mutex exclusively,
        // so if resetp != NULL, it means we filled the DFA state
        // cache with this search alone (without any other threads).
        // Benchmarks show that doing a state computation on every
        // byte runs at about 0.2 MB/s, while the NFA (nfa.cc) can do the
        // same at about 2 MB/s.  Unless we're processing an average
        // of 10 bytes per state computation, fail so that RE2 can
        // fall back to the NFA.  However, RE2::Set cannot fall back,
        // so we just have to keep on keeping on in that case.
        if (dfa_should_bail_when_slow && resetp != NULL &&
            static_cast<size_t>(p - resetp) < 10*state_cache_.size() &&
            kind_ != Prog::kManyMatch) {
          params->failed = true;
          return false;
        }
        resetp = p;

        // Prepare to save start and s across the reset.
        StateSaver save_start(this, start);
        StateSaver save_s(this, s);

        // Discard all the States in the cache.
        ResetCache(params->cache_lock);

        // Restore start and s so we can continue.
        if ((start = save_start.Restore()) == NULL ||
            (s = save_s.Restore()) == NULL) {
          // Restore already did LOG(DFATAL).
          params->failed = true;
          return false;
        }
        ns = RunStateOnByteUnlocked(s, c);
        if (ns == NULL) {
          LOG(DFATAL) << "RunStateOnByteUnlocked failed after ResetCache";
          params->failed = true;
          return false;
        }
      }
    }
    if (ns <= SpecialStateMax) {
      if (ns == DeadState) {
        params->ep = reinterpret_cast<const char*>(lastmatch);
        return matched;
      }
      // FullMatchState
      params->ep = reinterpret_cast<const char*>(ep);
      return true;
    }

    s = ns;
    if (s->IsMatch()) {
      matched = true;
      // The DFA notices the match one byte late,
      // so adjust p before using it in the match.
      if (run_forward)
        lastmatch = p - 1;
      else
        lastmatch = p + 1;
      if (params->matches != NULL && kind_ == Prog::kManyMatch) {
        for (int i = s->ninst_ - 1; i >= 0; i--) {
          int id = s->inst_[i];
          if (id == MatchSep)
            break;
          params->matches->insert(id);
        }
      }
      if (want_earliest_match) {
        params->ep = reinterpret_cast<const char*>(lastmatch);
        return true;
      }
    }
  }

  // Process one more byte to see if it triggers a match.
  // (Remember, matches are delayed one byte.)

  int lastbyte;
  if (run_forward) {
    if (EndPtr(params->text) == EndPtr(params->context))
      lastbyte = kByteEndText;
    else
      lastbyte = EndPtr(params->text)[0] & 0xFF;
  } else {
    if (BeginPtr(params->text) == BeginPtr(params->context))
      lastbyte = kByteEndText;
    else
      lastbyte = BeginPtr(params->text)[-1] & 0xFF;
  }

  State* ns = s->next_[ByteMap(lastbyte)].load(std::memory_order_acquire);
  if (ns == NULL) {
    ns = RunStateOnByteUnlocked(s, lastbyte);
    if (ns == NULL) {
      StateSaver save_s(this, s);
      ResetCache(params->cache_lock);
      if ((s = save_s.Restore()) == NULL) {
        params->failed = true;
        return false;
      }
      ns = RunStateOnByteUnlocked(s, lastbyte);
      if (ns == NULL) {
        LOG(DFATAL) << "RunStateOnByteUnlocked failed after Reset";
        params->failed = true;
        return false;
      }
    }
  }
  if (ns <= SpecialStateMax) {
    if (ns == DeadState) {
      params->ep = reinterpret_cast<const char*>(lastmatch);
      return matched;
    }
    // FullMatchState
    params->ep = reinterpret_cast<const char*>(ep);
    return true;
  }

  s = ns;
  if (s->IsMatch()) {
    matched = true;
    lastmatch = p;
    if (params->matches != NULL && kind_ == Prog::kManyMatch) {
      for (int i = s->ninst_ - 1; i >= 0; i--) {
        int id = s->inst_[i];
        if (id == MatchSep)
          break;
        params->matches->insert(id);
      }
    }
  }

  params->ep = reinterpret_cast<const char*>(lastmatch);
  return matched;
}